

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::btToLevel(Engine *this,int level)

{
  ostream *poVar1;
  string sStack_48;
  
  if (so.debug) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Engine::btToLevel( ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,level);
    std::operator<<(poVar1,")\n");
  }
  if ((this->trail_lim).sz != 0 || level != 0) {
    btToPos(this,(this->trail_lim).data[(uint)level]);
    (this->trail_lim).sz = level;
    if (so.debug == true) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"trail_lim is now: ");
      showVec_abi_cxx11_(&sStack_48,&this->trail_lim);
      poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    (this->dec_info).sz = level;
  }
  return;
}

Assistant:

void Engine::btToLevel(int level) {
	if (so.debug) {
		std::cerr << "Engine::btToLevel( " << level << ")\n";
	}
	if (decisionLevel() == 0 && level == 0) {
		return;
	}
	assert(decisionLevel() > level);

	btToPos(trail_lim[level]);
	trail_lim.resize(level);
	if (so.debug) {
		std::cerr << "trail_lim is now: " << showVec(trail_lim) << "\n";
	}
	dec_info.resize(level);
#ifdef HAS_VAR_IMPACT
	last_int = nullptr;
#endif
}